

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_offset_st_2regs(DisasContext_conflict14 *ctx,TCGv_i32 rh,TCGv_i32 rl,TCGv_i32 base,
                        int16_t con)

{
  TCGContext_conflict9 *s;
  TCGTemp *ts;
  undefined2 in_register_00000082;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  tcg_gen_addi_i32_tricore(s,(TCGv_i32)((long)ts - (long)s),base,CONCAT22(in_register_00000082,con))
  ;
  gen_st_2regs_64(ctx,rh,rl,(TCGv_i32)((long)ts - (long)s));
  tcg_temp_free_internal_tricore(s,ts);
  return;
}

Assistant:

static void gen_offset_st_2regs(DisasContext *ctx, TCGv rh, TCGv rl, TCGv base, int16_t con)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_tl(tcg_ctx, temp, base, con);
    gen_st_2regs_64(ctx, rh, rl, temp);
    tcg_temp_free(tcg_ctx, temp);
}